

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O3

void __thiscall OPLio::OPLwriteInitState(OPLio *this,bool initopl3)

{
  uint uVar1;
  uint uVar2;
  
  if (this->NumChips != 0) {
    uVar2 = 0;
    do {
      uVar1 = uVar2 << (this->IsOPL3 & 0x1fU);
      if ((this->IsOPL3 & initopl3) == 1) {
        (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0x105,1);
        (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0x104,0);
      }
      (*this->_vptr_OPLio[4])(this,(ulong)uVar1,1,0x20);
      (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0xb,0x40);
      (*this->_vptr_OPLio[4])(this,(ulong)uVar1,0xbd,0);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->NumChips);
  }
  OPLshutup(this);
  return;
}

Assistant:

void OPLio::OPLwriteInitState(bool initopl3)
{
	for (uint i = 0; i < NumChips; ++i)
	{
		int chip = i << (int)IsOPL3;
		if (IsOPL3 && initopl3)
		{
			OPLwriteReg(chip, 0x105, 0x01);	// enable YMF262/OPL3 mode
			OPLwriteReg(chip, 0x104, 0x00);	// disable 4-operator mode
		}
		OPLwriteReg(chip, 0x01, 0x20);	// enable Waveform Select
		OPLwriteReg(chip, 0x0B, 0x40);	// turn off CSW mode
		OPLwriteReg(chip, 0xBD, 0x00);	// set vibrato/tremolo depth to low, set melodic mode
	}
	OPLshutup();
}